

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

bool __thiscall
andres::
BinaryViewExpression<andres::View<float,true,std::allocator<unsigned_long>>,float,andres::View<float,true,std::allocator<unsigned_long>>,float,andres::marray_detail::Minus<float,float,float>>
::overlaps<float,false,std::allocator<unsigned_long>>
          (BinaryViewExpression<andres::View<float,true,std::allocator<unsigned_long>>,float,andres::View<float,true,std::allocator<unsigned_long>>,float,andres::marray_detail::Minus<float,float,float>>
           *this,View<float,_false,_std::allocator<unsigned_long>_> *v)

{
  bool bVar1;
  bool local_19;
  View<float,_false,_std::allocator<unsigned_long>_> *v_local;
  BinaryViewExpression<andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::View<float,_true,_std::allocator<unsigned_long>_>,_float,_andres::marray_detail::Minus<float,_float,_float>_>
  *this_local;
  
  bVar1 = View<float,true,std::allocator<unsigned_long>>::
          overlaps<float,false,std::allocator<unsigned_long>>
                    (*(View<float,true,std::allocator<unsigned_long>> **)this,v);
  local_19 = true;
  if (!bVar1) {
    local_19 = View<float,true,std::allocator<unsigned_long>>::
               overlaps<float,false,std::allocator<unsigned_long>>
                         (*(View<float,true,std::allocator<unsigned_long>> **)(this + 8),v);
  }
  return local_19;
}

Assistant:

bool overlaps(const View<Tv, isConst, A>& v) const
            { return e1_.overlaps(v) || e2_.overlaps(v); }